

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

void check_artifact_curses(artifact *art)

{
  int local_14;
  wchar_t i;
  artifact *art_local;
  
  local_14 = 0;
  while( true ) {
    if ((int)(uint)z_info->curse_max <= local_14) {
      mem_free(art->curses);
      art->curses = (int *)0x0;
      return;
    }
    if ((art->curses != (int *)0x0) && (art->curses[local_14] != 0)) break;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void check_artifact_curses(struct artifact *art)
{
	int i;

	/* Look for a valid curse, return if one found */
	for (i = 0; i < z_info->curse_max; i++) {
		if (art->curses && art->curses[i]) {
			return;
		}
	}

	/* Free the curse structure */
	mem_free(art->curses);
	art->curses = NULL;
}